

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O0

void variance128_sse2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int h,__m128i *sse,
                     __m128i *sum)

{
  int in_R8D;
  int offset1;
  int offset0;
  int j;
  int i;
  int local_48;
  int local_44;
  
  *_offset1 = 0;
  _offset1[1] = 0;
  for (local_44 = 0; local_44 < in_R8D; local_44 = local_44 + 1) {
    for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
      variance16_kernel_sse2(ref,(uint8_t *)CONCAT44(ref_stride,h),sse,_j);
      variance16_kernel_sse2(ref,(uint8_t *)CONCAT44(ref_stride,h),sse,_j);
    }
  }
  return;
}

Assistant:

static inline void variance128_sse2(const uint8_t *src, const int src_stride,
                                    const uint8_t *ref, const int ref_stride,
                                    const int h, __m128i *const sse,
                                    __m128i *const sum) {
  assert(h <= 8);  // May overflow for larger height.
  *sum = _mm_setzero_si128();

  for (int i = 0; i < h; ++i) {
    for (int j = 0; j < 4; ++j) {
      const int offset0 = j << 5;
      const int offset1 = offset0 + 16;
      variance16_kernel_sse2(src + offset0, ref + offset0, sse, sum);
      variance16_kernel_sse2(src + offset1, ref + offset1, sse, sum);
    }
    src += src_stride;
    ref += ref_stride;
  }
}